

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O1

bool __thiscall
Qentem::Value<wchar_t>::GroupBy
          (Value<wchar_t> *this,Value<wchar_t> *groupedValue,wchar_t *key,SizeT length)

{
  SizeT *pSVar1;
  bool bVar2;
  ulong uVar3;
  Value<wchar_t> *pVVar4;
  Value<wchar_t> *pVVar5;
  long lVar6;
  SizeT SVar7;
  Value<wchar_t> *this_00;
  byte bVar8;
  bool bVar9;
  uint local_84;
  Value<wchar_t> *local_80;
  wchar_t *local_78;
  SizeT local_6c;
  QNumber64 local_68;
  undefined8 uStack_60;
  HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
  local_58;
  anon_union_16_5_5c8fea6c_for_Value<wchar_t>_1 local_48;
  undefined1 local_38;
  
  for (; this->type_ == ValuePtr; this = (this->field_0).array_.storage_) {
  }
  if (this->type_ == Array) {
    _local_68 = (HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                 )(ZEXT816(0) << 0x40);
    this_00 = (this->field_0).array_.storage_;
    local_78 = (wchar_t *)0x0;
    local_84 = 0;
    local_58 = _local_68;
    reset(groupedValue);
    groupedValue->type_ = Object;
    bVar9 = true;
    if (((this_00 != (Value<wchar_t> *)0x0) && (this_00->type_ == Object)) &&
       (bVar2 = HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                ::GetKeyIndex((HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                               *)this_00,&local_6c,key,length), bVar2)) {
      pVVar4 = (this->field_0).array_.storage_ + (this->field_0).array_.index_;
      local_80 = pVVar4;
      do {
        key = (wchar_t *)(ulong)(this_00 == pVVar4);
        if (this_00 == pVVar4) goto LAB_0012d8b2;
        if (this_00->type_ != Object) break;
        uVar3 = (ulong)(this_00->field_0).array_.index_;
        bVar9 = uVar3 == 0;
        if (bVar9) {
LAB_0012d830:
          pVVar5 = HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>::Get
                             ((HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)
                              groupedValue,local_78,local_84);
          if (pVVar5->type_ == Array) {
LAB_0012d86e:
            local_48.number_.Natural = local_68;
            local_48._8_8_ = uStack_60;
            _local_68 = (HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                         )(ZEXT816(0) << 0x20);
            local_38 = 2;
            Array<Qentem::Value<wchar_t>_>::operator+=
                      ((Array<Qentem::Value<wchar_t>_> *)pVVar5,(Value<wchar_t> *)&local_48.array_);
            ~Value((Value<wchar_t> *)&local_48.array_);
          }
          else {
            if (pVVar5->type_ != Object) {
              reset(pVVar5);
              pVVar5->type_ = Array;
              goto LAB_0012d86e;
            }
            HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>::operator+=
                      ((HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)pVVar5,
                       (HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)&local_68);
          }
          this_00 = this_00 + 1;
        }
        else {
          pSVar1 = (this_00->field_0).object_.
                   super_HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                   .hashTable_;
          if (pSVar1 != (SizeT *)0x0) {
            lVar6 = uVar3 * 0x30;
            SVar7 = 0;
            for (pVVar5 = (Value<wchar_t> *)
                          (pSVar1 + (ulong)(this_00->field_0).array_.capacity_ + 6);
                lVar6 = lVar6 + -0x30, pVVar4 = local_80, pVVar5->type_ != Undefined;
                pVVar5 = pVVar5 + 2) {
              if (SVar7 == local_6c) {
                bVar2 = SetCharAndLength<unsigned_int>(pVVar5,&local_78,&local_84);
                if (!bVar2) {
                  local_58.index_ = 0;
                  bVar2 = CopyValueTo<Qentem::StringStream<wchar_t>,void(Qentem::StringStream<wchar_t>,wchar_t_const*,unsigned_int)>
                                    (pVVar5,(StringStream<wchar_t> *)&local_58,(RealFormatInfo)0xf,
                                     (_func_void_StringStream<wchar_t>_wchar_t_ptr_uint *)0x0);
                  pVVar4 = local_80;
                  if (!bVar2) break;
                  local_78 = (wchar_t *)local_58.hashTable_;
                  local_84 = local_58.index_;
                }
              }
              else {
                pVVar4 = HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>::Get
                                   ((HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)
                                    &local_68,pVVar5[-1].field_0.string_.storage_,
                                    pVVar5[-1].field_0.array_.index_);
                if (pVVar5 != pVVar4) {
                  reset(pVVar4);
                  copyValue(pVVar4,pVVar5);
                }
              }
              bVar9 = lVar6 == 0;
              pVVar4 = local_80;
              if (bVar9) goto LAB_0012d830;
              SVar7 = SVar7 + 1;
            }
          }
        }
      } while (bVar9);
      key = (wchar_t *)0x0;
LAB_0012d8b2:
      bVar9 = false;
    }
    bVar8 = (byte)key;
    HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
    ::~HashTable((HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                  *)&local_68);
    pSVar1 = local_58.hashTable_;
    if (local_58.hashTable_ != (SizeT *)0x0) {
      MemoryRecord::RemoveAllocation(local_58.hashTable_);
    }
    operator_delete(pSVar1);
    if (!bVar9) goto LAB_0012d8e3;
  }
  bVar8 = 0;
LAB_0012d8e3:
  return (bool)(bVar8 & 1);
}

Assistant:

bool GroupBy(Value &groupedValue, const Char_T *key, const SizeT length) const {
        const ValueType type = Type();

        if (type == ValueType::Array) {
            StringStream<Char_T> stream;
            ObjectT              new_sub_obj;
            const Value         *item_   = array_.First();
            const Char_T        *str     = nullptr;
            SizeT                str_len = 0;
            SizeT                grouped_key_index;

            groupedValue.reset();
            groupedValue.setTypeToObject();

            if ((item_ != nullptr) && item_->isObject() && item_->object_.GetKeyIndex(grouped_key_index, key, length)) {
                const Value *end = array_.End();

                while (item_ != end) {
                    if ((item_ != nullptr) && item_->isObject()) {
                        SizeT count = 0;

                        const VItem *obj_item = item_->object_.First();
                        const VItem *obj_end  = item_->object_.End();

                        while (obj_item != obj_end) {
                            if ((obj_item != nullptr) && !(obj_item->Value.isUndefined())) {
                                if (count != grouped_key_index) {
                                    new_sub_obj[obj_item->Key] = obj_item->Value;
                                } else if (!(obj_item->Value.SetCharAndLength(str, str_len))) {
                                    stream.Clear();

                                    if (obj_item->Value.CopyValueTo(stream)) {
                                        str     = stream.First();
                                        str_len = stream.Length();
                                    } else {
                                        return false;
                                    }
                                }

                                ++count;
                                ++obj_item;
                                continue;
                            }

                            return false;
                        }

                        groupedValue.object_.Get(str, str_len) += Memory::Move(new_sub_obj);

                        ++item_;
                        continue;
                    }

                    return false;
                }

                return true;
            }
        } else if (type == ValueType::ValuePtr) {
            return value_->GroupBy(groupedValue, key, length);
        }

        return false;
    }